

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

ps_search_t *
allphone_search_init
          (char *name,ngram_model_t *lm,ps_config_t *config,acmod_t *acmod,dict_t *dict,
          dict2pid_t *d2p)

{
  uint *puVar1;
  byte bVar2;
  bin_mdef_t *m;
  bin_mdef_t *pbVar3;
  bin_mdef_t *pbVar4;
  mdef_entry_t *pmVar5;
  ps_searchfuncs_t *ppVar6;
  logmath_t *plVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int32 iVar11;
  int32 iVar12;
  int32 iVar13;
  ps_search_t *search;
  ps_searchfuncs_t *ppVar14;
  ps_search_t *ppVar15;
  void *pvVar16;
  hmm_t *hmm;
  _func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *p_Var17;
  ushort *ptr;
  long lVar18;
  _func_char_ptr_ps_search_t_ptr_int32_ptr *p_Var19;
  ngram_model_t *pnVar20;
  char *pcVar21;
  ps_latlink_t *ppVar22;
  cmd_ln_t *pcVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  _func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *p_Var27;
  long lVar28;
  ps_searchfuncs_t **pppVar29;
  ulong uVar30;
  short sVar31;
  int iVar32;
  ushort *puVar33;
  ulong uVar34;
  uint uVar35;
  double dVar36;
  ulong local_68;
  
  search = (ps_search_t *)
           __ckd_calloc__(1,0x108,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                          ,0x217);
  ps_search_init(search,&allphone_funcs,"allphone",name,config,acmod,dict,d2p);
  m = acmod->mdef;
  local_68 = 0;
  ppVar14 = (ps_searchfuncs_t *)
            hmm_context_init(m->n_emit_state,acmod->tmat->tp,(int16 *)0x0,m->sseq);
  search[1].vt = ppVar14;
  if (ppVar14 == (ps_searchfuncs_t *)0x0) {
    (*search->vt->free)(search);
LAB_0011b5a1:
    search = (ps_search_t *)0x0;
  }
  else {
    iVar9 = ps_config_bool(config,"allphone_ci");
    *(int *)&search[1].name = iVar9;
    dVar36 = ps_config_float(config,"lw");
    *(int *)&search[1].dict = (int)dVar36;
    pbVar3 = search->acmod->mdef;
    ppVar15 = (ps_search_t *)
              __ckd_calloc__((long)pbVar3->n_ciphone,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0xeb);
    search[1].pls = ppVar15;
    pvVar16 = __ckd_calloc__((long)pbVar3->n_phone,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0xed);
    uVar35 = (&pbVar3->n_ciphone)[*(int *)&search[1].name == 0];
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0xf2,"Building PHMM net of %d phones\n",(ulong)uVar35);
    uVar30 = 0;
    if (0 < (int)uVar35) {
      uVar30 = (ulong)uVar35;
    }
    for (uVar34 = 0; uVar34 != uVar30; uVar34 = uVar34 + 1) {
      pbVar4 = search->acmod->mdef;
      uVar26 = uVar34;
      if ((long)pbVar4->n_ciphone <= (long)uVar34) {
        uVar26 = (ulong)pbVar4->phone[uVar34].info.ci.reserved[0];
      }
      pppVar29 = &(search[1].pls)->vt + uVar26;
      while (hmm = (hmm_t *)*pppVar29, hmm != (hmm_t *)0x0) {
        pmVar5 = pbVar4->phone;
        if ((pmVar5[*(int *)&hmm[1].ctx].tmat == pmVar5[uVar34].tmat) &&
           (pmVar5[*(int *)&hmm[1].ctx].ssid == pmVar5[uVar34].ssid)) goto LAB_0011b192;
        pppVar29 = (ps_searchfuncs_t **)((long)hmm[1].score + 0x10);
      }
      hmm = (hmm_t *)__ckd_calloc__(1,0x80,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                    ,0xf6);
      hmm_init((hmm_context_t *)search[1].vt,hmm,0,pbVar3->phone[uVar34].ssid,
               pbVar3->phone[uVar34].tmat);
      *(int *)&hmm[1].ctx = (int)uVar34;
      uVar8 = (ushort)uVar34;
      if ((long)pbVar3->n_ciphone <= (long)uVar34) {
        uVar8 = (ushort)pbVar3->phone[uVar34].info.ci.reserved[0];
      }
      *(ushort *)((long)&hmm[1].ctx + 4) = uVar8;
      hmm[1].history[1] = 0;
      hmm[1].history[2] = 0;
      ppVar15 = search[1].pls;
      *(ps_searchfuncs_t **)(hmm[1].score + 4) = (&ppVar15->vt)[(short)uVar8];
      (&ppVar15->vt)[(short)uVar8] = (ps_searchfuncs_t *)hmm;
      local_68 = (ulong)((int)local_68 + 1);
LAB_0011b192:
      *(hmm_t **)((long)pvVar16 + uVar34 * 8) = hmm;
    }
    iVar10 = (pbVar3->n_ciphone + 0x1f) / 0x20;
    iVar9 = iVar10 * (int)local_68;
    p_Var17 = (_func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *)
              __ckd_calloc__((long)(iVar9 * 2),4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0x105);
    p_Var27 = p_Var17 + (long)iVar9 * 4;
    iVar9 = pbVar3->n_ciphone;
    lVar28 = (long)iVar10 * 4;
    for (sVar31 = 0; sVar31 < iVar9; sVar31 = sVar31 + 1) {
      pppVar29 = &(search[1].pls)->vt + sVar31;
      while (ppVar14 = *pppVar29, ppVar14 != (ps_searchfuncs_t *)0x0) {
        ppVar14[1].reinit = p_Var17;
        ppVar14[1].free = (_func_void_ps_search_t_ptr *)p_Var27;
        p_Var27 = p_Var27 + lVar28;
        p_Var17 = p_Var17 + lVar28;
        pppVar29 = (ps_searchfuncs_t **)&ppVar14[1].lattice;
      }
    }
    ptr = (ushort *)
          __ckd_calloc__((long)iVar9 + 1,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                         ,0x113);
    uVar8 = 0;
    iVar9 = 0;
    while( true ) {
      iVar10 = pbVar3->n_ciphone;
      lVar28 = (long)iVar10;
      if (iVar10 <= (short)uVar8) break;
      lVar28 = *(long *)((long)pvVar16 + (long)(short)uVar8 * 8);
      memset(*(void **)(lVar28 + 0x60),0xff,(long)((iVar10 + 0x1f) / 0x20) << 2);
      memset(*(void **)(lVar28 + 0x68),0xff,(long)((pbVar3->n_ciphone + 0x1f) / 0x20) << 2);
      if (pbVar3->phone[(short)uVar8].info.ci.filler != '\0') {
        ptr[iVar9] = uVar8;
        iVar9 = iVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    ptr[iVar9] = 0xffff;
    for (; lVar28 < (int)uVar35; lVar28 = lVar28 + 1) {
      lVar18 = *(long *)((long)pvVar16 + lVar28 * 8);
      pmVar5 = pbVar3->phone;
      bVar2 = pmVar5[lVar28].info.ci.reserved[1];
      puVar33 = ptr;
      if (pmVar5[bVar2].info.ci.filler == '\0') {
        puVar1 = (uint *)(*(long *)(lVar18 + 0x60) + (ulong)(bVar2 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << (bVar2 & 0x1f);
      }
      else {
        for (; uVar8 = *puVar33, -1 < (short)uVar8; puVar33 = puVar33 + 1) {
          puVar1 = (uint *)(*(long *)(lVar18 + 0x60) + (ulong)(uVar8 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar8 & 0x1f);
        }
      }
      bVar2 = pmVar5[lVar28].info.ci.reserved[2];
      puVar33 = ptr;
      if (pmVar5[bVar2].info.ci.filler == '\0') {
        puVar1 = (uint *)(*(long *)(lVar18 + 0x68) + (ulong)(bVar2 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << (bVar2 & 0x1f);
      }
      else {
        for (; uVar8 = *puVar33, -1 < (short)uVar8; puVar33 = puVar33 + 1) {
          puVar1 = (uint *)(*(long *)(lVar18 + 0x68) + (ulong)(uVar8 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar8 & 0x1f);
        }
      }
    }
    ckd_free(pvVar16);
    ckd_free(ptr);
    ppVar15 = search[1].pls;
    pbVar3 = search->acmod->mdef;
    pvVar16 = __ckd_calloc__((long)pbVar3->n_ciphone + 1,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0xb5);
    uVar35 = 0;
    iVar9 = 0;
    while( true ) {
      iVar10 = (int)(short)iVar9;
      if (pbVar3->n_ciphone <= iVar10) break;
      pppVar29 = &ppVar15->vt + iVar10;
      while (ppVar14 = *pppVar29, ppVar14 != (ps_searchfuncs_t *)0x0) {
        iVar32 = 0;
        iVar25 = 0;
        while( true ) {
          uVar24 = (uint)(short)iVar25;
          lVar28 = (long)iVar32;
          if (pbVar3->n_ciphone <= (int)uVar24) break;
          if ((*(uint *)(ppVar14[1].free + (long)(short)((short)iVar25 / 0x20) * 4) >>
               (uVar24 & 0x1f) & 1) != 0) {
            iVar32 = iVar32 + 1;
            *(uint *)((long)pvVar16 + lVar28 * 4) = uVar24;
          }
          iVar25 = uVar24 + 1;
        }
        *(undefined4 *)((long)pvVar16 + lVar28 * 4) = 0xffffffff;
        lVar28 = 0;
        while (lVar18 = (long)*(int *)((long)pvVar16 + lVar28 * 4), -1 < lVar18) {
          pppVar29 = &ppVar15->vt + lVar18;
          while (ppVar6 = *pppVar29, ppVar6 != (ps_searchfuncs_t *)0x0) {
            if ((*(uint *)(ppVar6[1].reinit + (long)(short)((short)iVar9 / 0x20) * 4) &
                (uint)(1L << ((byte)iVar9 & 0x1f))) != 0) {
              p_Var19 = (_func_char_ptr_ps_search_t_ptr_int32_ptr *)
                        __ckd_calloc__(1,0x10,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                       ,200);
              *(ps_searchfuncs_t **)p_Var19 = ppVar6;
              *(_func_char_ptr_ps_search_t_ptr_int32_ptr **)(p_Var19 + 8) = ppVar14[1].hyp;
              ppVar14[1].hyp = p_Var19;
              uVar35 = uVar35 + 1;
            }
            pppVar29 = (ps_searchfuncs_t **)&ppVar6[1].lattice;
          }
          lVar28 = lVar28 + 1;
        }
        pppVar29 = (ps_searchfuncs_t **)&ppVar14[1].lattice;
      }
      iVar9 = iVar10 + 1;
    }
    ckd_free(pvVar16);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x13b,"%d nodes, %d links\n",local_68,(ulong)uVar35);
    if (lm == (ngram_model_t *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
              ,0x244,
              "Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n"
             );
      plVar7 = acmod->lmath;
      dVar36 = ps_config_float(config,"pip");
      iVar9 = logmath_log(plVar7,(float64)dVar36);
      *(int *)((long)&search[1].dict + 4) = iVar9 * *(int *)&search[1].dict >> 10;
    }
    else {
      pnVar20 = ngram_model_retain(lm);
      search[1].type = (char *)pnVar20;
      pcVar21 = bin_mdef_ciphone_str(m,m->sil);
      iVar11 = ngram_wid(pnVar20,pcVar21);
      iVar12 = ngram_unknown_wid((ngram_model_t *)search[1].type);
      if (iVar11 == iVar12) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                ,0x231,"Phonetic LM does not have SIL phone in vocabulary\n");
        allphone_search_free(search);
        goto LAB_0011b5a1;
      }
      pcVar23 = (cmd_ln_t *)
                __ckd_calloc__((long)m->n_ciphone,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                               ,0x238);
      search[1].config = pcVar23;
      for (lVar28 = 0; lVar28 < m->n_ciphone; lVar28 = lVar28 + 1) {
        pnVar20 = (ngram_model_t *)search[1].type;
        pcVar21 = bin_mdef_ciphone_str(m,(int32)lVar28);
        iVar12 = ngram_wid(pnVar20,pcVar21);
        (&(search[1].config)->refcount)[lVar28] = iVar12;
        iVar13 = ngram_unknown_wid((ngram_model_t *)search[1].type);
        if (iVar12 == iVar13) {
          (&(search[1].config)->refcount)[lVar28] = iVar11;
        }
      }
    }
    *(undefined4 *)&search[1].hyp_str = 0;
    *(undefined4 *)&search[1].d2p = 0xffffffff;
    search[1].post = 0;
    search[1].n_words = 0;
    plVar7 = acmod->lmath;
    dVar36 = ps_config_float(config,"beam");
    iVar9 = logmath_log(plVar7,(float64)dVar36);
    *(int *)&search[1].acmod = iVar9 >> 10;
    plVar7 = acmod->lmath;
    dVar36 = ps_config_float(config,"pbeam");
    iVar9 = logmath_log(plVar7,(float64)dVar36);
    *(int *)((long)&search[1].acmod + 4) = iVar9 >> 10;
    ppVar22 = (ps_latlink_t *)blkarray_list_init();
    search[1].last_link = ppVar22;
    dVar36 = ps_config_float(config,"ascale");
    *(float *)((long)&search[1].d2p + 4) = (float)(1.0 / dVar36);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x261,"Allphone(beam: %d, pbeam: %d)\n",(ulong)*(uint *)&search[1].acmod,
            (ulong)*(uint *)((long)&search[1].acmod + 4));
    ptmr_init((ptmr_t *)&search[1].start_wid);
  }
  return search;
}

Assistant:

ps_search_t *
allphone_search_init(const char *name,
                     ngram_model_t * lm,
                     ps_config_t * config,
                     acmod_t * acmod, dict_t * dict, dict2pid_t * d2p)
{
    int i;
    bin_mdef_t *mdef;
    allphone_search_t *allphs;

    allphs = (allphone_search_t *) ckd_calloc(1, sizeof(*allphs));
    ps_search_init(ps_search_base(allphs), &allphone_funcs, PS_SEARCH_TYPE_ALLPHONE, name, config, acmod,
                   dict, d2p);
    mdef = acmod->mdef;

    allphs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(mdef),
                                      acmod->tmat->tp, NULL, mdef->sseq);
    if (allphs->hmmctx == NULL) {
        ps_search_free(ps_search_base(allphs));
        return NULL;
    }

    allphs->ci_only = ps_config_bool(config, "allphone_ci");
    allphs->lw = ps_config_float(config, "lw");

    phmm_build(allphs);

    if (lm) {
	int32 silwid;
	
        allphs->lm = ngram_model_retain(lm);
        
        silwid = ngram_wid(allphs->lm, bin_mdef_ciphone_str(mdef,
                                                            mdef_silphone
                                                            (mdef)));
	if (silwid == ngram_unknown_wid(allphs->lm)) {
	    E_ERROR("Phonetic LM does not have SIL phone in vocabulary\n");
	    allphone_search_free((ps_search_t *) allphs);
	    return NULL;
	}
        
        allphs->ci2lmwid =
            (int32 *) ckd_calloc(mdef->n_ciphone,
                                 sizeof(*allphs->ci2lmwid));
        for (i = 0; i < mdef->n_ciphone; i++) {
            allphs->ci2lmwid[i] =
                ngram_wid(allphs->lm,
                          (char *) bin_mdef_ciphone_str(mdef, i));
            /* Map filler phones and other missing phones to silence if not found */
            if (allphs->ci2lmwid[i] == ngram_unknown_wid(allphs->lm))
                allphs->ci2lmwid[i] = silwid;
        }
    }
    else {
        E_WARN
            ("Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n");
        allphs->inspen =
            (int32) (logmath_log
                     (acmod->lmath, ps_config_float(config, "pip"))
                     * allphs->lw) >> SENSCR_SHIFT;
    }

    allphs->n_tot_frame = 0;
    allphs->frame = -1;
    allphs->segments = NULL;

    /* Get search pruning parameters */
    allphs->beam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    allphs->pbeam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    allphs->history = blkarray_list_init();

    /* Acoustic score scale for posterior probabilities. */
    allphs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("Allphone(beam: %d, pbeam: %d)\n", allphs->beam, allphs->pbeam);

    ptmr_init(&allphs->perf);

    return (ps_search_t *) allphs;
}